

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall
ktx::OutputStream::writeKTX2(OutputStream *this,ktxTexture *texture,Reporter *report)

{
  int iVar1;
  long in_RSI;
  string *in_RDI;
  ktx_error_code_e ret;
  string *in_stack_ffffffffffffff38;
  path *in_stack_ffffffffffffff40;
  string local_90 [32];
  string local_70 [7];
  format in_stack_ffffffffffffff97;
  char **in_stack_ffffffffffffff98;
  path *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char (*in_stack_ffffffffffffffb8) [46];
  ReturnCode in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  
  iVar1 = (**(code **)(*(long *)(in_RSI + 8) + 0x58))(in_RSI,*(undefined8 *)(in_RDI + 0x20));
  if (iVar1 != 0) {
    if (*(long *)(in_RDI + 0x20) != _stdout) {
      std::__cxx11::string::string(local_90,in_RDI);
      DecodeUTF8Path(in_stack_ffffffffffffff38);
      in_stack_ffffffffffffffb0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::c_str();
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff97);
      std::filesystem::remove((path *)&stack0xffffffffffffffb8);
      std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffff40);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
    }
    ktxErrorString(iVar1);
    Reporter::fatal<char_const(&)[46],std::__cxx11::string&,char_const*>
              ((Reporter *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void OutputStream::writeKTX2(ktxTexture* texture, Reporter& report) {
    const auto ret = ktxTexture_WriteToStdioStream(texture, file);
    if (KTX_SUCCESS != ret) {
        if (file != stdout)
            std::filesystem::remove(DecodeUTF8Path(filepath).c_str());
        report.fatal(rc::IO_FAILURE, "Failed to write KTX file \"{}\": KTX error: {}.", filepath, ktxErrorString(ret));
    }

    // TODO: Investigate and resolve the portability issue with the C++ streams. The issue will most likely
    //       be in StreambufStream's position reporting and seeking. Currently a fallback is implemented in C above.
    // StreambufStream<std::streambuf*> stream(activeStream->rdbuf(), std::ios::in | std::ios::binary);
    // const auto ret = ktxTexture_WriteToStream(texture, stream.stream());
    //
    // if (KTX_SUCCESS != ret) {
    //     if (activeStream != &std::cout)
    //         std::filesystem::remove(DecodeUTF8Path(filepath).c_str());
    //     report.fatal(rc::IO_FAILURE, "Failed to write KTX file \"{}\": {}.", fmtOutFile(filepath), ktxErrorString(ret));
    // }
}